

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

int32_t utrie_serialize_63(UNewTrie *trie,void *dt,int32_t capacity,
                          UNewTrieGetFoldedValue *getFoldedValue,UBool reduceTo16Bits,
                          UErrorCode *pErrorCode)

{
  int iVar1;
  uint32_t *puVar2;
  UBool UVar3;
  int iVar4;
  uint32_t value;
  code *pcVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  UNewTrie *pUVar11;
  int iVar12;
  ulong uVar13;
  int32_t *piVar14;
  ulong uVar15;
  ulong uVar16;
  undefined2 *__dest;
  int32_t *piVar17;
  uint uVar18;
  byte bVar19;
  int32_t local_b8 [34];
  
  bVar19 = 0;
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((capacity < 0 || trie == (UNewTrie *)0x0) || (dt == (void *)0x0 && 0 < capacity)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (trie->isCompacted != '\0') goto LAB_00315677;
  pcVar5 = defaultGetFoldedValue;
  if (getFoldedValue != (UNewTrieGetFoldedValue *)0x0) {
    pcVar5 = getFoldedValue;
  }
  iVar4 = 0;
  utrie_compact(trie,'\0',pErrorCode);
  piVar14 = trie->index + 0x6c0;
  piVar17 = local_b8;
  for (lVar10 = 0x20; lVar10 != 0; lVar10 = lVar10 + -1) {
    *piVar17 = *piVar14;
    piVar14 = piVar14 + (ulong)bVar19 * -2 + 1;
    piVar17 = piVar17 + (ulong)bVar19 * -2 + 1;
  }
  uVar7 = trie->leadUnitValue;
  puVar2 = trie->data;
  if (uVar7 == *puVar2) {
LAB_0031574d:
    lVar10 = 0x6c0;
    do {
      trie->index[lVar10] = iVar4;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x6e0);
    uVar8 = 0x10000;
    uVar13 = 0x800;
    do {
      if (trie->index[(int)uVar8 >> 5] == 0) {
        uVar8 = uVar8 + 0x20;
      }
      else {
        uVar18 = uVar8 & 0xfffffc00;
        iVar4 = (int)uVar13;
        uVar16 = uVar13;
        if (0x800 < iVar4) {
          piVar14 = trie->index + 0x800;
          uVar15 = 0x800;
          do {
            uVar16 = uVar15;
            lVar10 = 0;
            while (piVar14[lVar10] == trie->index[((int)uVar18 >> 5) + lVar10]) {
              lVar10 = lVar10 + 1;
              if (lVar10 == 0x20) goto LAB_003157e5;
            }
            uVar15 = uVar16 + 0x20;
            piVar14 = piVar14 + 0x20;
            uVar16 = uVar13;
          } while (uVar15 < uVar13);
        }
LAB_003157e5:
        value = (*pcVar5)(trie,uVar18,(int)uVar16 + 0x20);
        uVar6 = (short)(uVar8 >> 10) + 0xd7c0;
        uVar7 = 0;
        if (trie->isCompacted == '\0') {
          iVar1 = trie->index[uVar6 >> 5];
          iVar12 = -iVar1;
          if (0 < iVar1) {
            iVar12 = iVar1;
          }
          uVar7 = trie->data[(uVar8 >> 10 & 0x1f) + iVar12];
        }
        if (value != uVar7) {
          UVar3 = utrie_set32_63(trie,(uint)uVar6,value);
          if (UVar3 == '\0') {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            goto LAB_003159ef;
          }
          if ((int)uVar16 == iVar4) {
            memmove(trie->index + iVar4,trie->index + ((int)uVar18 >> 5),0x80);
            uVar13 = (ulong)(iVar4 + 0x20);
          }
        }
        uVar8 = uVar18 + 0x400;
      }
    } while ((int)uVar8 < 0x110000);
    iVar4 = (int)uVar13;
    if (iVar4 < 0x8800) {
      memmove(trie->index + 0x820,trie->index + 0x800,(long)(iVar4 * 4 + -0x2000));
      piVar14 = local_b8;
      piVar17 = trie->index + 0x800;
      for (lVar10 = 0x20; lVar10 != 0; lVar10 = lVar10 + -1) {
        *piVar17 = *piVar14;
        piVar14 = piVar14 + (ulong)bVar19 * -2 + 1;
        piVar17 = piVar17 + (ulong)bVar19 * -2 + 1;
      }
      trie->indexLength = iVar4 + 0x20;
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  else {
    uVar8 = trie->dataLength;
    iVar4 = uVar8 + 0x20;
    uVar18 = 0xffffffff;
    if (iVar4 <= trie->dataCapacity) {
      trie->dataLength = iVar4;
      uVar18 = uVar8;
    }
    if (-1 < (int)uVar18) {
      uVar13 = 0xfffffffffffffffc;
      do {
        *(uint32_t *)((long)puVar2 + uVar13 + (ulong)uVar18 * 4 + 4) = uVar7;
        uVar13 = uVar13 + 4;
      } while (uVar13 < 0x7c);
      iVar4 = -uVar18;
      goto LAB_0031574d;
    }
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_003159ef:
  utrie_compact(trie,'\x01',pErrorCode);
  trie->isCompacted = '\x01';
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
LAB_00315677:
  iVar4 = trie->dataLength;
  if (reduceTo16Bits != '\0') {
    iVar4 = iVar4 + trie->indexLength;
  }
  if (0x3ffff < iVar4) {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  iVar4 = trie->indexLength;
  if (reduceTo16Bits == '\0') {
    iVar1 = trie->dataLength * 4 + iVar4 * 2;
  }
  else {
    iVar1 = (trie->dataLength + iVar4) * 2;
  }
  if (iVar1 + 0x10 <= capacity) {
    *(undefined4 *)dt = 0x54726965;
    uVar8 = (uint)(reduceTo16Bits == '\0') << 8;
    *(uint *)((long)dt + 4) = uVar8 | 0x25;
    if (trie->isLatin1Linear != '\0') {
      *(uint *)((long)dt + 4) = uVar8 | 0x225;
    }
    __dest = (undefined2 *)((long)dt + 0x10);
    *(int *)((long)dt + 8) = iVar4;
    iVar12 = trie->dataLength;
    *(int *)((long)dt + 0xc) = iVar12;
    if (reduceTo16Bits == '\0') {
      if (0 < iVar4) {
        iVar4 = iVar4 + 1;
        pUVar11 = trie;
        do {
          piVar14 = pUVar11->index;
          pUVar11 = (UNewTrie *)(pUVar11->index + 1);
          *__dest = (short)((uint)*piVar14 >> 2);
          __dest = __dest + 1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
      memcpy(__dest,trie->data,(long)iVar12 << 2);
    }
    else {
      if (0 < iVar4) {
        iVar9 = iVar4 + 1;
        pUVar11 = trie;
        do {
          piVar14 = pUVar11->index;
          pUVar11 = (UNewTrie *)(pUVar11->index + 1);
          *__dest = (short)((uint)(*piVar14 + iVar4) >> 2);
          __dest = __dest + 1;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
      }
      if (0 < iVar12) {
        puVar2 = trie->data;
        iVar12 = iVar12 + 1;
        lVar10 = 0;
        do {
          *(undefined2 *)((long)__dest + lVar10) = *(undefined2 *)((long)puVar2 + lVar10 * 2);
          iVar12 = iVar12 + -1;
          lVar10 = lVar10 + 2;
        } while (1 < iVar12);
      }
    }
  }
  return iVar1 + 0x10;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_serialize(UNewTrie *trie, void *dt, int32_t capacity,
                UNewTrieGetFoldedValue *getFoldedValue,
                UBool reduceTo16Bits,
                UErrorCode *pErrorCode) {
    UTrieHeader *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t i, length;
    uint8_t* data = NULL;

    /* argument check */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(trie==NULL || capacity<0 || (capacity>0 && dt==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(getFoldedValue==NULL) {
        getFoldedValue=defaultGetFoldedValue;
    }

    data = (uint8_t*)dt;
    /* fold and compact if necessary, also checks that indexLength is within limits */
    if(!trie->isCompacted) {
        /* compact once without overlap to improve folding */
        utrie_compact(trie, FALSE, pErrorCode);

        /* fold the supplementary part of the index array */
        utrie_fold(trie, getFoldedValue, pErrorCode);

        /* compact again with overlap for minimum data array length */
        utrie_compact(trie, TRUE, pErrorCode);

        trie->isCompacted=TRUE;
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }
    }

    /* is dataLength within limits? */
    if( (reduceTo16Bits ? (trie->dataLength+trie->indexLength) : trie->dataLength) >= UTRIE_MAX_DATA_LENGTH) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    }

    length=sizeof(UTrieHeader)+2*trie->indexLength;
    if(reduceTo16Bits) {
        length+=2*trie->dataLength;
    } else {
        length+=4*trie->dataLength;
    }

    if(length>capacity) {
        return length; /* preflighting */
    }

#ifdef UTRIE_DEBUG
    printf("**UTrieLengths(serialize)** index:%6ld  data:%6ld  serialized:%6ld\n",
           (long)trie->indexLength, (long)trie->dataLength, (long)length);
#endif

    /* set the header fields */
    header=(UTrieHeader *)data;
    data+=sizeof(UTrieHeader);

    header->signature=0x54726965; /* "Trie" */
    header->options=UTRIE_SHIFT | (UTRIE_INDEX_SHIFT<<UTRIE_OPTIONS_INDEX_SHIFT);

    if(!reduceTo16Bits) {
        header->options|=UTRIE_OPTIONS_DATA_IS_32_BIT;
    }
    if(trie->isLatin1Linear) {
        header->options|=UTRIE_OPTIONS_LATIN1_IS_LINEAR;
    }

    header->indexLength=trie->indexLength;
    header->dataLength=trie->dataLength;

    /* write the index (stage 1) array and the 16/32-bit data (stage 2) array */
    if(reduceTo16Bits) {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT, after adding indexLength */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)((*p++ + trie->indexLength)>>UTRIE_INDEX_SHIFT);
        }

        /* write 16-bit data values */
        p=trie->data;
        for(i=trie->dataLength; i>0; --i) {
            *dest16++=(uint16_t)*p++;
        }
    } else {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)(*p++ >> UTRIE_INDEX_SHIFT);
        }

        /* write 32-bit data values */
        uprv_memcpy(dest16, trie->data, 4*(size_t)trie->dataLength);
    }

    return length;
}